

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_>::
findBucketWithHash<ReplaceExtraCompilerCacheKey>
          (Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_> *this,
          ReplaceExtraCompilerCacheKey *key,size_t hash)

{
  byte bVar1;
  bool bVar2;
  Span *pSVar3;
  ulong uVar4;
  Span *pSVar5;
  Bucket BVar6;
  
  uVar4 = this->numBuckets - 1 & hash;
  pSVar3 = this->spans + (uVar4 >> 7);
  uVar4 = (ulong)((uint)uVar4 & 0x7f);
  do {
    bVar1 = pSVar3->offsets[uVar4];
    if ((ulong)bVar1 == 0xff) {
LAB_0018bd6b:
      bVar2 = false;
    }
    else {
      bVar2 = ReplaceExtraCompilerCacheKey::operator==
                        ((ReplaceExtraCompilerCacheKey *)
                         ((pSVar3->entries->storage).data + (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8),
                         key);
      if (bVar2) goto LAB_0018bd6b;
      uVar4 = uVar4 + 1;
      bVar2 = true;
      if (uVar4 == 0x80) {
        pSVar5 = pSVar3 + 1;
        pSVar3 = this->spans;
        if (((long)pSVar5 - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
            != 0) {
          pSVar3 = pSVar5;
        }
        uVar4 = 0;
      }
    }
    if (!bVar2) {
      BVar6.index = uVar4;
      BVar6.span = pSVar3;
      return BVar6;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }